

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<int_*>::TPZVec(TPZVec<int_*> *this,initializer_list<int_*> *list)

{
  ulong uVar1;
  iterator ppiVar2;
  int **ppiVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813fb0;
  this->fStore = (int **)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    lVar4 = 0;
    ppiVar3 = (int **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = ppiVar3;
    ppiVar2 = list->_M_array;
    do {
      *(undefined8 *)((long)ppiVar3 + lVar4) = *(undefined8 *)((long)ppiVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (uVar1 * 8 - lVar4 != 0);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}